

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O1

uint crnlib::pixel_format_helpers::get_bpp(pixel_format fmt)

{
  uint uVar1;
  
  uVar1 = 4;
  if ((int)fmt < 0x41424752) {
    if ((int)fmt < 0x32545844) {
      if (0x31545843 < (int)fmt) {
        if ((fmt != PIXEL_FMT_DXT1) && (fmt != PIXEL_FMT_ETC2)) {
          if (fmt != PIXEL_FMT_3DC) {
            return 0;
          }
          return 8;
        }
        return uVar1;
      }
      if (fmt == PIXEL_FMT_ETC1) {
        return uVar1;
      }
      if (fmt != PIXEL_FMT_DXT5A) {
        return 0;
      }
      return uVar1;
    }
    if ((int)fmt < 0x35545844) {
      if (((fmt != PIXEL_FMT_DXT2) && (fmt != PIXEL_FMT_DXT3)) && (fmt != PIXEL_FMT_DXT4)) {
        return 0;
      }
    }
    else if (fmt != PIXEL_FMT_DXT5) {
      if (fmt == PIXEL_FMT_DXT1A) {
        return uVar1;
      }
      if (fmt != PIXEL_FMT_ETC2A) {
        return 0;
      }
    }
  }
  else if ((int)fmt < 0x53315445) {
    if ((int)fmt < 0x52424741) {
      if (fmt == PIXEL_FMT_A8R8G8B8) {
        return 0x20;
      }
      if (fmt == PIXEL_FMT_A8L8) {
        return 0x10;
      }
      if (fmt != PIXEL_FMT_A8) {
        return 0;
      }
    }
    else if (((fmt != PIXEL_FMT_DXT5_AGBR) && (fmt != PIXEL_FMT_DXT5_xGBR)) &&
            (fmt != PIXEL_FMT_DXT5_xGxR)) {
      return 0;
    }
  }
  else if ((int)fmt < 0x59784343) {
    if (fmt == PIXEL_FMT_ETC1S) {
      return uVar1;
    }
    if ((fmt != PIXEL_FMT_ETC2AS) && (fmt != PIXEL_FMT_DXN)) {
      return 0;
    }
  }
  else if (fmt != PIXEL_FMT_DXT5_CCxY) {
    if (fmt == PIXEL_FMT_R8G8B8) {
      return 0x18;
    }
    if (fmt != PIXEL_FMT_L8) {
      return 0;
    }
  }
  return 8;
}

Assistant:

inline uint get_bpp(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_DXT1:
                return 4;
            case PIXEL_FMT_DXT1A:
                return 4;
            case PIXEL_FMT_ETC1:
                return 4;
            case PIXEL_FMT_ETC2:
                return 4;
            case PIXEL_FMT_ETC2A:
                return 8;
            case PIXEL_FMT_ETC1S:
                return 4;
            case PIXEL_FMT_ETC2AS:
                return 8;
            case PIXEL_FMT_DXT2:
                return 8;
            case PIXEL_FMT_DXT3:
                return 8;
            case PIXEL_FMT_DXT4:
                return 8;
            case PIXEL_FMT_DXT5:
                return 8;
            case PIXEL_FMT_3DC:
                return 8;
            case PIXEL_FMT_DXT5A:
                return 4;
            case PIXEL_FMT_R8G8B8:
                return 24;
            case PIXEL_FMT_A8R8G8B8:
                return 32;
            case PIXEL_FMT_A8:
                return 8;
            case PIXEL_FMT_L8:
                return 8;
            case PIXEL_FMT_A8L8:
                return 16;
            case PIXEL_FMT_DXN:
                return 8;
            case PIXEL_FMT_DXT5_CCxY:
                return 8;
            case PIXEL_FMT_DXT5_xGxR:
                return 8;
            case PIXEL_FMT_DXT5_xGBR:
                return 8;
            case PIXEL_FMT_DXT5_AGBR:
                return 8;
            default:
                break;
            }
            CRNLIB_ASSERT(false);
            return 0;
        }